

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

void VectorTestMain(void)

{
  ElementType EVar1;
  int iVar2;
  Vector *V_00;
  ostream *poVar3;
  Vector *V_01;
  Vector *pVVar4;
  int local_24;
  int i_1;
  Vector *tmp;
  int i;
  Vector *V;
  
  V_00 = (Vector *)malloc(0x10);
  InitVector(V_00,10);
  for (tmp._4_4_ = 10; tmp._4_4_ < 0x33; tmp._4_4_ = tmp._4_4_ + 10) {
    Insert(V_00,tmp._4_4_,0);
  }
  std::operator<<((ostream *)&std::cout,"After initVector:");
  printOut(V_00);
  poVar3 = std::operator<<((ostream *)&std::cout,"The node(pos 3) is:");
  EVar1 = GetNode(V_00,3);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,EVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"The position of node 30 is:");
  iVar2 = Find(V_00,0x1e);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Remove(V_00,2);
  std::operator<<((ostream *)&std::cout,"After removing the node(pos:2),the Vector is:");
  printOut(V_00);
  V_01 = (Vector *)malloc(0x10);
  InitVector(V_01,5);
  for (local_24 = 10; local_24 < 0x3d; local_24 = local_24 + 0x14) {
    Insert(V_01,local_24,0);
  }
  std::operator<<((ostream *)&std::cout,"VectorA is:");
  printOut(V_00);
  std::operator<<((ostream *)&std::cout,"VectorB is:");
  printOut(V_01);
  std::operator<<((ostream *)&std::cout,"The Union of VectorA and VectorB is:");
  pVVar4 = Union(V_00,V_01);
  printOut(pVVar4);
  std::operator<<((ostream *)&std::cout,"The Intersection of VectorA and VectorB is:");
  pVVar4 = Intersection(V_00,V_01);
  printOut(pVVar4);
  FreeVector(V_00);
  FreeVector(V_01);
  return;
}

Assistant:

void VectorTestMain()
{
    Vector *V = (Vector *)malloc(sizeof(Vector));
    InitVector(V,10);
    for(int i = 10; i <= 50; i+=10)
        Insert(V,i,0);
    cout << "After initVector:";
    printOut(V);
    cout << "The node(pos 3) is:" << GetNode(V,3) << endl;
    cout << "The position of node 30 is:" << Find(V,30) << endl;
    Remove(V,2);
    cout << "After removing the node(pos:2),the Vector is:";
    printOut(V);
    Vector *tmp = (Vector *)malloc(sizeof(Vector));
    InitVector(tmp,5);
    for(int i = 10; i <= 60; i+=20)
        Insert(tmp,i,0);
    cout << "VectorA is:";
    printOut(V);
    cout << "VectorB is:";
    printOut(tmp);
    cout << "The Union of VectorA and VectorB is:";
    printOut(Union(V,tmp));
    cout << "The Intersection of VectorA and VectorB is:";
    printOut(Intersection(V,tmp));
    FreeVector(V);
    FreeVector(tmp);
}